

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_wipe.cpp
# Opt level: O0

bool wipe_ScreenWipe(int ticks)

{
  int width;
  int height;
  bool rc;
  int ticks_local;
  
  if (CurrentWipeType == 0) {
    rc = true;
  }
  else {
    width = DCanvas::GetWidth((DCanvas *)screen);
    height = DCanvas::GetHeight((DCanvas *)screen);
    V_MarkRect(0,0,width,height);
    rc = (*wipes[(CurrentWipeType + -1) * 3 + 1])(ticks);
  }
  return rc;
}

Assistant:

bool wipe_ScreenWipe (int ticks)
{
	bool rc;

	if (CurrentWipeType == wipe_None)
		return true;

	// do a piece of wipe-in
	V_MarkRect(0, 0, SCREENWIDTH, SCREENHEIGHT);
	rc = (*wipes[(CurrentWipeType-1)*3+1])(ticks);

	return rc;
}